

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>
  *this_00;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar8;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar9;
  value_type vVar10;
  
  iVar5 = (this->right_->fadexpr_).left_.constant_;
  this_00 = &((this->right_->fadexpr_).right_)->fadexpr_;
  dVar1 = this_00->left_->val_;
  pFVar8 = (this_00->right_->fadexpr_).left_;
  pFVar9 = (this_00->right_->fadexpr_).right_;
  iVar6 = (pFVar8->fadexpr_).left_.constant_;
  dVar2 = ((pFVar8->fadexpr_).right_)->val_;
  iVar7 = (pFVar9->fadexpr_).left_.constant_;
  dVar3 = ((pFVar9->fadexpr_).right_)->val_;
  dVar4 = (this->left_->dx_).ptr_to_data[i];
  vVar10 = FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>
           ::fastAccessDx(this_00,i);
  return ((double)iVar5 - dVar1 / (((double)iVar7 + dVar3) * ((double)iVar6 + dVar2))) * dVar4 -
         vVar10 * this->left_->val_;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}